

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O3

int grad_calc(custom_function *funcpt,double *x,int N,double *dx,double eps2,double *f)

{
  double *__dest;
  char *__format;
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  __dest = (double *)malloc((long)N * 8);
  if (0 < N) {
    uVar1 = 0;
    do {
      dVar2 = x[uVar1];
      if (ABS(dVar2) < 1.0 / ABS(dx[uVar1])) {
        dVar2 = signx(dVar2);
        dVar2 = dVar2 / ABS(dx[uVar1]);
      }
      memcpy(__dest,x,(ulong)(uint)N * 8);
      __dest[uVar1] = __dest[uVar1] + dVar2 * eps2;
      dVar3 = (*funcpt->funcpt)(__dest,N,funcpt->params);
      dVar4 = (*funcpt->funcpt)(x,N,funcpt->params);
      dVar2 = (dVar3 - dVar4) / (dVar2 * eps2);
      f[uVar1] = dVar2;
      if (1.79769313486232e+308 <= ABS(dVar2)) {
        __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_00141bb3:
        printf(__format);
        free(__dest);
        return 0xf;
      }
      if (NAN(dVar2)) {
        __format = "Program Exiting as the function returns NaN";
        goto LAB_00141bb3;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  free(__dest);
  return 0;
}

Assistant:

int grad_calc(custom_function *funcpt, double *x, int N, double *dx, double eps2, double *f) {
	int i, j,retval;
	double step, fd, stepmax;
	double *xi;

	fd = eps2; // square root of macheps
	retval = 0;
	xi = (double*)malloc(sizeof(double)*N);

	for (i = 0; i < N; ++i) {
		if (fabs(x[i]) >= 1.0 / fabs(dx[i])) {
			stepmax = x[i];
		}
		else {
			stepmax = signx(x[i]) * 1.0 / fabs(dx[i]);
		}
		step = fd * stepmax;
		for (j = 0; j < N; ++j) {
			xi[j] = x[j];
		}
		xi[i] += step;
		f[i] = (FUNCPT_EVAL(funcpt, xi, N) - FUNCPT_EVAL(funcpt, x, N)) / step;
		if (f[i] >= DBL_MAX || f[i] <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(xi);
			return 15;
		}
		if (f[i] != f[i]) {
			printf("Program Exiting as the function returns NaN");
			free(xi);
			return 15;
		}
		//xi[i] -= step;
	}

	free(xi);
	return retval;

}